

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ServerManager.cpp
# Opt level: O1

size_t __thiscall ServerManager::addCommand(ServerManager *this,IRCCommand *command)

{
  pointer puVar1;
  IRC_Bot *this_00;
  int iVar2;
  undefined4 extraout_var;
  unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_> *server;
  pointer puVar3;
  
  puVar1 = (this->m_servers).
           super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_servers).
                super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    this_00 = (puVar3->_M_t).super___uniq_ptr_impl<IRC_Bot,_std::default_delete<IRC_Bot>_>._M_t.
              super__Tuple_impl<0UL,_IRC_Bot_*,_std::default_delete<IRC_Bot>_>.
              super__Head_base<0UL,_IRC_Bot_*,_false>._M_head_impl;
    iVar2 = (*(command->super_Command)._vptr_Command[5])(command);
    IRC_Bot::addCommand(this_00,(IRCCommand *)CONCAT44(extraout_var,iVar2));
  }
  return (long)(this->m_servers).
               super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)(this->m_servers).
               super__Vector_base<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>,_std::allocator<std::unique_ptr<IRC_Bot,_std::default_delete<IRC_Bot>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start >> 3;
}

Assistant:

size_t ServerManager::addCommand(IRCCommand *command) {
	for (const auto& server : m_servers) {
		server->addCommand(command->copy());
	}

	return m_servers.size();
}